

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstream.cpp
# Opt level: O3

void __thiscall
embree::StringStream::StringStream
          (StringStream *this,Ref<embree::Stream<int>_> *cin,string *seps,string *endl,
          bool multiLine)

{
  Stream<int> *pSVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  allocator_type local_31;
  
  (this->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_RefCount._vptr_RefCount = (_func_int **)&PTR__Stream_002c4fa8;
  (this->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  start = 0;
  (this->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  past = 0;
  (this->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  future = 0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
  ::vector(&(this->
            super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).buffer,0x400,&local_31);
  (this->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_RefCount._vptr_RefCount = (_func_int **)&PTR__StringStream_002c8328;
  pSVar1 = cin->ptr;
  (this->cin).ptr = pSVar1;
  if (pSVar1 != (Stream<int> *)0x0) {
    (*(pSVar1->super_RefCount)._vptr_RefCount[2])();
  }
  (this->endl)._M_dataplus._M_p = (pointer)&(this->endl).field_2;
  pcVar2 = (endl->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->endl,pcVar2,pcVar2 + endl->_M_string_length);
  this->multiLine = multiLine;
  memset(this->isSepMap,0,0x100);
  if (seps->_M_string_length != 0) {
    uVar5 = 0;
    do {
      this->isSepMap[(byte)(seps->_M_dataplus)._M_p[uVar5]] = true;
      uVar5 = uVar5 + 1;
    } while (uVar5 < seps->_M_string_length);
  }
  memset(this->isValidCharMap,0,0x100);
  lVar4 = _DAT_002cafa8;
  lVar3 = stringChars_abi_cxx11_;
  if (_DAT_002cafa8 != 0) {
    lVar6 = 0;
    do {
      this->isValidCharMap[*(byte *)(lVar3 + lVar6)] = true;
      lVar6 = lVar6 + 1;
    } while (lVar4 != lVar6);
  }
  return;
}

Assistant:

StringStream::StringStream(const Ref<Stream<int> >& cin, const std::string& seps, const std::string& endl, bool multiLine)
    : cin(cin), endl(endl), multiLine(multiLine)
  {
    createCharMap(isSepMap,seps);
    createCharMap(isValidCharMap,stringChars);
  }